

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  push_heap_suite::run();
  pop_heap_suite::run();
  lower_bound_sorted_suite::run();
  push_sorted_suite::run();
  pop_sorted_suite::pop_increasing();
  pop_sorted_suite::pop_decreasing();
  pop_sorted_suite::pop_alternating();
  insertion_sort_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    push_heap_suite::run();
    pop_heap_suite::run();

    lower_bound_sorted_suite::run();
    push_sorted_suite::run();
    pop_sorted_suite::run();
    insertion_sort_suite::run();

    return boost::report_errors();
}